

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O3

void __thiscall CLI::App::run_callback(App *this)

{
  pointer ppAVar1;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> local_28;
  
  (**this->_vptr_App)();
  if ((this->callback_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->callback_)._M_invoker)((_Any_data *)&this->callback_);
  }
  std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::vector(&local_28,&this->parsed_subcommands_)
  ;
  for (ppAVar1 = local_28.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppAVar1 !=
      local_28.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppAVar1 = ppAVar1 + 1) {
    run_callback(*ppAVar1);
  }
  if (local_28.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void run_callback() {
        pre_callback();
        if(callback_)
            callback_();
        for(App *subc : get_subcommands()) {
            subc->run_callback();
        }
    }